

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>::
Update<duckdb::BitpackingCompressionState<duckdb::hugeint_t,true,duckdb::hugeint_t>::BitpackingWriter>
          (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t> *this,hugeint_t value,bool is_valid)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  int64_t iVar4;
  uint64_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  hugeint_t local_58;
  hugeint_t local_48;
  
  iVar4 = value.upper;
  uVar5 = value.lower;
  lVar3 = *(long *)(this + 0x10818);
  this[lVar3 + 0x10018] = (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)is_valid;
  this[0x108a0] =
       (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)((byte)this[0x108a0] & is_valid);
  this[0x108a1] =
       (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)((byte)this[0x108a1] & !is_valid);
  if (is_valid) {
    lVar1 = *(long *)(this + 0x8010);
    *(uint64_t *)(lVar1 + lVar3 * 0x10) = uVar5;
    *(int64_t *)(lVar1 + 8 + lVar3 * 0x10) = iVar4;
    local_48.lower = *(uint64_t *)(this + 0x10830);
    local_48.upper = *(int64_t *)(this + 0x10838);
    local_58.lower = uVar5;
    local_58.upper = iVar4;
    bVar2 = hugeint_t::operator<(&local_48,&local_58);
    uVar9 = (uint)bVar2;
    uVar6 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar7 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar8 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar9 = (int)(uVar9 << 0x1f) >> 0x1f;
    *(uint *)(this + 0x10830) = uVar6 & (uint)local_48.lower | ~uVar6 & (uint)local_58.lower;
    *(uint *)(this + 0x10834) = uVar7 & local_48.lower._4_4_ | ~uVar7 & local_58.lower._4_4_;
    *(uint *)(this + 0x10838) = uVar8 & (uint)local_48.upper | ~uVar8 & (uint)local_58.upper;
    *(uint *)(this + 0x1083c) = uVar9 & local_48.upper._4_4_ | ~uVar9 & local_58.upper._4_4_;
    local_48.lower = *(uint64_t *)(this + 0x10840);
    local_48.upper = *(int64_t *)(this + 0x10848);
    local_58.lower = uVar5;
    local_58.upper = iVar4;
    bVar2 = hugeint_t::operator>(&local_48,&local_58);
    uVar9 = (uint)bVar2;
    uVar6 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar7 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar8 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar9 = (int)(uVar9 << 0x1f) >> 0x1f;
    *(uint *)(this + 0x10840) = uVar6 & (uint)local_48.lower | ~uVar6 & (uint)local_58.lower;
    *(uint *)(this + 0x10844) = uVar7 & local_48.lower._4_4_ | ~uVar7 & local_58.lower._4_4_;
    *(uint *)(this + 0x10848) = uVar8 & (uint)local_48.upper | ~uVar8 & (uint)local_58.upper;
    *(uint *)(this + 0x1084c) = uVar9 & local_48.upper._4_4_ | ~uVar9 & local_58.upper._4_4_;
    lVar3 = *(long *)(this + 0x10818);
  }
  *(long *)(this + 0x10818) = lVar3 + 1;
  bVar2 = true;
  if (lVar3 + 1 == 0x800) {
    bVar2 = Flush<duckdb::BitpackingCompressionState<duckdb::hugeint_t,true,duckdb::hugeint_t>::BitpackingWriter>
                      (this);
    BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::Reset
              ((BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)this);
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}